

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad.c
# Opt level: O3

void biquad_allpass(uint32_t rate,float freq,float Q,biquad_data *state)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  state->x[0] = 0.0;
  state->x[1] = 0.0;
  state->y[0] = 0.0;
  state->y[1] = 0.0;
  fVar1 = freq / ((float)rate * 0.5);
  fVar5 = 0.0;
  if ((fVar1 <= 0.0) || (1.0 <= fVar1)) {
    uVar3 = 0x3f800000;
  }
  else {
    if (0.0 < Q) {
      fVar2 = sinf(fVar1 * 6.2831855);
      fVar2 = fVar2 / (Q + Q);
      fVar1 = cosf(fVar1 * 6.2831855);
      fVar5 = fVar2 + 1.0;
      fVar4 = 1.0 / fVar5;
      fVar2 = (1.0 - fVar2) * fVar4;
      state->b[0] = fVar2;
      fVar5 = fVar5 * fVar4;
      fVar1 = fVar4 * -2.0 * fVar1;
      state->b[1] = fVar1;
      goto LAB_00124b8d;
    }
    uVar3 = 0xbf800000;
  }
  *(ulong *)state->b = (ulong)uVar3;
  fVar1 = 0.0;
  fVar2 = 0.0;
LAB_00124b8d:
  state->b[2] = fVar5;
  state->a[0] = fVar1;
  state->a[1] = fVar2;
  return;
}

Assistant:

void biquad_allpass(uint32_t rate, float freq, float Q, struct biquad_data *state){
  biquad_reset(state);
  float nyquist = rate * 0.5f;
  freq /= nyquist;

  if (freq <= 0.0f || freq >= 1.0f)
    state_passthrough(state);
  else if (Q <= 0.0f)
    state_scale(state, -1.0f); // invert the sample
  else{
    float w0    = (float)M_PI * 2.0f * freq;
    float alpha = sinf(w0) / (2.0f * Q);
    float k     = cosf(w0);
    float a0inv = 1.0f / (1.0f + alpha);
    state->b[0] = a0inv * (1.0f - alpha);
    state->b[1] = a0inv * -2.0f * k;
    state->b[2] = a0inv * (1.0f + alpha);
    state->a[0] = a0inv * -2.0f * k;
    state->a[1] = a0inv * (1.0f - alpha);
  }
}